

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make.cc
# Opt level: O1

bool __thiscall GNUmakeTokenPool::Acquire(GNUmakeTokenPool *this)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if (this->available_ < 1) {
    iVar1 = (*(this->super_TokenPool)._vptr_TokenPool[10])();
    if ((char)iVar1 == '\0') {
      bVar2 = false;
    }
    else {
      this->available_ = this->available_ + 1;
    }
  }
  return bVar2;
}

Assistant:

bool GNUmakeTokenPool::Acquire() {
  if (available_ > 0)
    return true;

  if (AcquireToken()) {
    // token acquired
    available_++;
    return true;
  }

  // no token available
  return false;
}